

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_numbers.c
# Opt level: O1

fio_str_info_s * fio_f2str(fio_str_info_s *__return_storage_ptr__,FIOBJ o)

{
  double num;
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  long *in_FS_OFFSET;
  
  num = *(double *)((o & 0xfffffffffffffff8) + 8);
  if (NAN(num)) {
    __return_storage_ptr__->capa = 0;
    __return_storage_ptr__->len = 3;
    pcVar2 = "NaN";
  }
  else {
    if (ABS(num) != INFINITY) {
      __return_storage_ptr__->capa = 0;
      lVar1 = *in_FS_OFFSET;
      sVar3 = fio_ftoa((char *)(lVar1 + -0x260),num,'\n');
      __return_storage_ptr__->len = sVar3;
      __return_storage_ptr__->data = (char *)(lVar1 + -0x260);
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->capa = 0;
    if (num <= 0.0) {
      __return_storage_ptr__->len = 9;
      pcVar2 = "-Infinity";
    }
    else {
      __return_storage_ptr__->len = 8;
      pcVar2 = "Infinity";
    }
  }
  __return_storage_ptr__->data = pcVar2;
  return __return_storage_ptr__;
}

Assistant:

static fio_str_info_s fio_f2str(const FIOBJ o) {
  if (isnan(obj2float(o)->f))
    return (fio_str_info_s){.data = (char *)"NaN", .len = 3};
  else if (isinf(obj2float(o)->f)) {
    if (obj2float(o)->f > 0)
      return (fio_str_info_s){.data = (char *)"Infinity", .len = 8};
    else
      return (fio_str_info_s){.data = (char *)"-Infinity", .len = 9};
  }
  return (fio_str_info_s){
      .data = num_buffer,
      .len = fio_ftoa(num_buffer, obj2float(o)->f, 10),
  };
}